

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFileLocation.cxx
# Opt level: O3

void __thiscall
cmSourceFileLocation::cmSourceFileLocation
          (cmSourceFileLocation *this,cmMakefile *mf,string *name,cmSourceFileLocationKind kind)

{
  string *in_name;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  string local_50;
  
  this->Makefile = mf;
  this->AmbiguousDirectory = true;
  this->AmbiguousExtension = true;
  in_name = &this->Directory;
  (this->Directory)._M_dataplus._M_p = (pointer)&(this->Directory).field_2;
  (this->Directory)._M_string_length = 0;
  (this->Directory).field_2._M_local_buf[0] = '\0';
  (this->Name)._M_dataplus._M_p = (pointer)&(this->Name).field_2;
  (this->Name)._M_string_length = 0;
  (this->Name).field_2._M_local_buf[0] = '\0';
  bVar2 = cmsys::SystemTools::FileIsFullPath(name);
  this->AmbiguousDirectory = !bVar2;
  this->AmbiguousExtension = true;
  cmsys::SystemTools::GetFilenamePath(&local_50,name);
  std::__cxx11::string::operator=((string *)in_name,(string *)&local_50);
  paVar1 = &local_50.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  bVar2 = cmsys::SystemTools::FileIsFullPath(in_name);
  if (bVar2) {
    cmsys::SystemTools::CollapseFullPath(&local_50,in_name);
    std::__cxx11::string::operator=((string *)in_name,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  cmsys::SystemTools::GetFilenameName(&local_50,name);
  std::__cxx11::string::operator=((string *)&this->Name,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (kind == Known) {
    DirectoryUseSource(this);
    this->AmbiguousExtension = false;
  }
  else {
    UpdateExtension(this,name);
  }
  return;
}

Assistant:

cmSourceFileLocation::cmSourceFileLocation(cmMakefile const* mf,
                                           const std::string& name,
                                           cmSourceFileLocationKind kind)
  : Makefile(mf)
{
  this->AmbiguousDirectory = !cmSystemTools::FileIsFullPath(name);
  this->AmbiguousExtension = true;
  this->Directory = cmSystemTools::GetFilenamePath(name);
  if (cmSystemTools::FileIsFullPath(this->Directory)) {
    this->Directory = cmSystemTools::CollapseFullPath(this->Directory);
  }
  this->Name = cmSystemTools::GetFilenameName(name);
  if (kind == cmSourceFileLocationKind::Known) {
    this->DirectoryUseSource();
    this->AmbiguousExtension = false;
  } else {
    this->UpdateExtension(name);
  }
}